

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MetisWriter.cc
# Opt level: O2

ssize_t __thiscall MetisWriter::write(MetisWriter *this,int __fd,void *__buf,size_t __n)

{
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar1;
  ostream *poVar2;
  ostream *extraout_RAX;
  ofstream *outputfile;
  undefined4 in_register_00000034;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__x;
  vector<unsigned_long,_std::allocator<unsigned_long>_> neighbors;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> _Stack_38;
  
  outputfile = &(this->super_Writer).outputFileBuffer;
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)outputfile);
  poVar2 = std::operator<<(poVar2," ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  pvVar1 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
           ((undefined8 *)CONCAT44(in_register_00000034,__fd))[1];
  for (__x = *(vector<unsigned_long,_std::allocator<unsigned_long>_> **)
              CONCAT44(in_register_00000034,__fd); __x != pvVar1; __x = __x + 1) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&_Stack_38,__x);
    writeMetisLine(outputfile,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&_Stack_38);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&_Stack_38);
    poVar2 = extraout_RAX;
  }
  return (ssize_t)poVar2;
}

Assistant:

void MetisWriter::write(std::vector< std::vector<uint64_t> > adj_list,
        uint64_t vertices,
        uint64_t edges) {
    outputFileBuffer << vertices << " " << edges << std::endl;
    for (std::vector<uint64_t> neighbors : adj_list) {
        writeMetisLine(&outputFileBuffer, neighbors);
    }
}